

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nurse.cpp
# Opt level: O2

string * __thiscall Nurse::Day_Getter_abi_cxx11_(string *__return_storage_ptr__,Nurse *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->Day);
  return __return_storage_ptr__;
}

Assistant:

string Nurse ::Day_Getter(){
    return Day;
}